

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::GetCallbackInlineeCodeGenRuntimeData
          (FunctionBody *this,ProfileId profiledCallSiteId)

{
  FunctionCodeGenRuntimeData *pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  void *pvVar5;
  FunctionCodeGenRuntimeData *local_28;
  
  if (this->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ab9,"(profiledCallSiteId < profiledCallSiteCount)",
                                "profiledCallSiteId < profiledCallSiteCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,CodeGenCallbackRuntimeData);
  if (pvVar5 == (void *)0x0) {
    local_28 = (FunctionCodeGenRuntimeData *)0x0;
  }
  else {
    pFVar1 = *(FunctionCodeGenRuntimeData **)((long)pvVar5 + (ulong)profiledCallSiteId * 8);
    Memory::Recycler::WBSetBit((char *)&local_28);
    local_28 = pFVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
  }
  return local_28;
}

Assistant:

const FunctionCodeGenRuntimeData * FunctionBody::GetCallbackInlineeCodeGenRuntimeData(const ProfileId profiledCallSiteId) const
    {
        Assert(profiledCallSiteId < profiledCallSiteCount);

        Field(FunctionCodeGenRuntimeData*)* codeGenRuntimeData = this->GetCodeGenCallbackRuntimeDataWithLock();
        return codeGenRuntimeData ? codeGenRuntimeData[profiledCallSiteId] : nullptr;
    }